

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O0

int send_streams_blocked(quicly_conn_t *conn,int uni,quicly_send_context_t *s)

{
  int iVar1;
  st_quicly_conn_t *l;
  long *min_space;
  uint8_t *puVar2;
  long in_RDX;
  quicly_state_t in_ESI;
  long in_RDI;
  quicly_sent_t *sent;
  quicly_stream_t *oldest_blocked_stream;
  st_quicly_max_streams_t *max_streams;
  int ret;
  quicly_linklist_t *blocked_list;
  undefined4 in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  quicly_maxsender_t *m;
  st_quicly_conn_t *arg0;
  quicly_conn_t *in_stack_ffffffffffffffb8;
  int local_4;
  
  if (in_ESI == QUICLY_STATE_FIRSTFLIGHT) {
    l = (st_quicly_conn_t *)(in_RDI + 0x798);
  }
  else {
    l = (st_quicly_conn_t *)(in_RDI + 0x788);
  }
  arg0 = l;
  iVar1 = quicly_linklist_is_linked((quicly_linklist_t *)l);
  if (iVar1 == 0) {
    local_4 = 0;
  }
  else {
    if (in_ESI == QUICLY_STATE_FIRSTFLIGHT) {
      min_space = (long *)(in_RDI + 0x6c8);
    }
    else {
      min_space = (long *)(in_RDI + 0x6a0);
    }
    m = (quicly_maxsender_t *)*min_space;
    if (m != (quicly_maxsender_t *)
             ((long)(*(st_quicly_linklist_t **)&(l->super).state)[-0x10].next / 4)) {
      __assert_fail("max_streams->count == oldest_blocked_stream->stream_id / 4",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/../lib/quicly.c"
                    ,0xe63,"int send_streams_blocked(quicly_conn_t *, int, quicly_send_context_t *)"
                   );
    }
    iVar1 = quicly_maxsender_should_send_blocked((quicly_maxsender_t *)(min_space + 1),*min_space);
    if (iVar1 == 0) {
      local_4 = 0;
    }
    else {
      local_4 = allocate_ack_eliciting_frame
                          (in_stack_ffffffffffffffb8,(quicly_send_context_t *)arg0,(size_t)min_space
                           ,(quicly_sent_t **)m,
                           (quicly_sent_acked_cb)
                           CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
      if (local_4 == 0) {
        puVar2 = quicly_encode_streams_blocked_frame
                           ((uint8_t *)m,in_stack_ffffffffffffff9c,0x15327e);
        *(uint8_t **)(in_RDX + 0x58) = puVar2;
        (in_stack_ffffffffffffffb8->super).state = in_ESI;
        quicly_maxsender_record
                  (m,CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                   (quicly_maxsender_sent_t *)0x1532b9);
        *(long *)(in_RDI + 0x3f8) = *(long *)(in_RDI + 0x3f8) + 1;
        QUICLY_TRACER_STREAMS_BLOCKED_SEND
                  (arg0,(int64_t)min_space,(uint64_t)m,in_stack_ffffffffffffff9c);
        local_4 = 0;
      }
    }
  }
  return local_4;
}

Assistant:

static int send_streams_blocked(quicly_conn_t *conn, int uni, quicly_send_context_t *s)
{
    quicly_linklist_t *blocked_list = uni ? &conn->egress.pending_streams.blocked.uni : &conn->egress.pending_streams.blocked.bidi;
    int ret;

    if (!quicly_linklist_is_linked(blocked_list))
        return 0;

    struct st_quicly_max_streams_t *max_streams = uni ? &conn->egress.max_streams.uni : &conn->egress.max_streams.bidi;
    quicly_stream_t *oldest_blocked_stream =
        (void *)((char *)blocked_list->next - offsetof(quicly_stream_t, _send_aux.pending_link.control));
    assert(max_streams->count == oldest_blocked_stream->stream_id / 4);

    if (!quicly_maxsender_should_send_blocked(&max_streams->blocked_sender, max_streams->count))
        return 0;

    quicly_sent_t *sent;
    if ((ret = allocate_ack_eliciting_frame(conn, s, QUICLY_STREAMS_BLOCKED_FRAME_CAPACITY, &sent, on_ack_streams_blocked)) != 0)
        return ret;
    s->dst = quicly_encode_streams_blocked_frame(s->dst, uni, max_streams->count);
    sent->data.streams_blocked.uni = uni;
    quicly_maxsender_record(&max_streams->blocked_sender, max_streams->count, &sent->data.streams_blocked.args);

    ++conn->super.stats.num_frames_sent.streams_blocked;
    QUICLY_PROBE(STREAMS_BLOCKED_SEND, conn, conn->stash.now, max_streams->count, uni);

    return 0;
}